

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

bool __thiscall
Rml::Context::ProcessMouseButtonDown(Context *this,int button_index,int key_modifier_state)

{
  bool bVar1;
  int iVar2;
  Mode MVar3;
  SystemInterface *pSVar4;
  iterator __first;
  iterator __last;
  ComputedValues *this_00;
  pointer pSVar5;
  type this_01;
  Element *pEVar6;
  double extraout_XMM0_Qa;
  bool local_149;
  bool local_c1;
  undefined1 local_c0 [8];
  Dictionary scroll_parameters;
  Drag drag_style;
  __normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
  local_88;
  const_iterator local_80;
  double click_time;
  Vector2<int> VStack_68;
  float max_mouse_distance;
  Vector2<int> local_60;
  float local_58;
  undefined4 local_54;
  float mouse_distance_squared;
  Element *new_focus;
  bool propagate;
  undefined1 local_38 [8];
  Dictionary parameters;
  int key_modifier_state_local;
  int button_index_local;
  Context *this_local;
  
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = key_modifier_state;
  parameters.m_container.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = button_index;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
              *)local_38);
  GenerateMouseEventParameters
            (this,(flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                   *)local_38,
             parameters.m_container.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
  GenerateKeyModifierEventParameters
            (this,(Dictionary *)local_38,
             (int)parameters.m_container.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  new_focus._3_1_ = 1;
  if (parameters.m_container.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0) {
    _mouse_distance_squared = this->hover;
    if ((((this->hover != (Element *)0x0) &&
         (_mouse_distance_squared = FindFocusElement(this->hover),
         _mouse_distance_squared != (Element *)0x0)) && (_mouse_distance_squared != this->focus)) &&
       (bVar1 = Element::Focus(_mouse_distance_squared,false), !bVar1)) {
      bVar1 = IsMouseInteracting(this);
      goto LAB_004cb4bd;
    }
    this->active = _mouse_distance_squared;
    if (this->hover != (Element *)0x0) {
      new_focus._3_1_ = Element::DispatchEvent(this->hover,Mousedown,(Dictionary *)local_38);
    }
    if ((new_focus._3_1_ & 1) != 0) {
      VStack_68.x = (this->last_click_mouse_position).x;
      VStack_68.y = (this->last_click_mouse_position).y;
      local_60 = Vector2<int>::operator-(&this->mouse_position,VStack_68);
      iVar2 = Vector2<int>::SquaredMagnitude(&local_60);
      local_58 = (float)iVar2;
      click_time._4_4_ = this->density_independent_pixel_ratio * 3.0;
      pSVar4 = GetSystemInterface();
      (*pSVar4->_vptr_SystemInterface[2])();
      if (((this->active != this->last_click_element) ||
          (0.5 <= (float)(extraout_XMM0_Qa - this->last_click_time))) ||
         (click_time._4_4_ * click_time._4_4_ <= local_58)) {
        this->last_click_element = this->active;
        this->last_click_time = extraout_XMM0_Qa;
      }
      else {
        if (this->hover != (Element *)0x0) {
          new_focus._3_1_ = Element::DispatchEvent(this->hover,Dblclick,(Dictionary *)local_38);
        }
        this->last_click_element = (Element *)0x0;
        this->last_click_time = 0.0;
      }
    }
    this->last_click_mouse_position = this->mouse_position;
    local_88._M_current =
         (Element **)
         ::std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>::end(&this->active_chain);
    __gnu_cxx::
    __normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
    ::__normal_iterator<Rml::Element**>
              ((__normal_iterator<Rml::Element*const*,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>
                *)&local_80,&local_88);
    __first = itlib::
              flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
              ::begin(&this->hover_chain);
    __last = itlib::
             flat_set<Rml::Element_*,_itlib::fsimpl::less,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
             ::end(&this->hover_chain);
    ::std::vector<Rml::Element*,std::allocator<Rml::Element*>>::
    insert<__gnu_cxx::__normal_iterator<Rml::Element**,std::vector<Rml::Element*,std::allocator<Rml::Element*>>>,void>
              ((vector<Rml::Element*,std::allocator<Rml::Element*>> *)&this->active_chain,local_80,
               (__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                )__first._M_current,
               (__normal_iterator<Rml::Element_**,_std::vector<Rml::Element_*,_std::allocator<Rml::Element_*>_>_>
                )__last._M_current);
    if ((new_focus._3_1_ & 1) != 0) {
      this->drag_started = false;
      this->drag = this->hover;
      while (this->drag != (Element *)0x0) {
        this_00 = Element::GetComputedValues(this->drag);
        scroll_parameters.m_container.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ =
             Style::ComputedValues::drag(this_00);
        if (scroll_parameters.m_container.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == None) {
          pEVar6 = Element::GetParentNode(this->drag);
          this->drag = pEVar6;
        }
        else {
          if (scroll_parameters.m_container.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ != Block) {
            local_149 = scroll_parameters.m_container.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == DragDrop ||
                        scroll_parameters.m_container.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ == Clone;
            this->drag_verbose = local_149;
            break;
          }
          this->drag = (Element *)0x0;
        }
      }
    }
  }
  else if (this->hover != (Element *)0x0) {
    new_focus._3_1_ = Element::DispatchEvent(this->hover,Mousedown,(Dictionary *)local_38);
  }
  pSVar5 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
           operator->(&this->scroll_controller);
  MVar3 = ScrollController::GetMode(pSVar5);
  if (MVar3 == Autoscroll) {
    pSVar5 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>::
             operator->(&this->scroll_controller);
    ScrollController::Reset(pSVar5);
  }
  else if (((parameters.m_container.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 2) &&
           (this->hover != (Element *)0x0)) && ((new_focus._3_1_ & 1) != 0)) {
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                *)local_c0);
    GenerateMouseEventParameters
              (this,(flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                     *)local_c0,-1);
    GenerateKeyModifierEventParameters
              (this,(Dictionary *)local_c0,
               (int)parameters.m_container.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_c1 = true;
    this_01 = itlib::
              flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
              ::operator[]<char_const(&)[11]>
                        ((flat_map<std::__cxx11::string,Rml::Variant,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,Rml::Variant>,std::allocator<std::pair<std::__cxx11::string,Rml::Variant>>>>
                          *)local_c0,(char (*) [11])"autoscroll");
    Variant::operator=(this_01,&local_c1);
    bVar1 = Element::DispatchEvent(this->hover,Mousescroll,(Dictionary *)local_c0);
    if (bVar1) {
      pSVar5 = ::std::unique_ptr<Rml::ScrollController,_std::default_delete<Rml::ScrollController>_>
               ::operator->(&this->scroll_controller);
      pEVar6 = Element::GetClosestScrollableContainer(this->hover);
      ScrollController::ActivateAutoscroll(pSVar5,pEVar6,this->mouse_position);
    }
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
                 *)local_c0);
  }
  bVar1 = IsMouseInteracting(this);
LAB_004cb4bd:
  this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  local_54 = 1;
  itlib::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  ::~flat_map((flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
               *)local_38);
  return this_local._7_1_;
}

Assistant:

bool Context::ProcessMouseButtonDown(int button_index, int key_modifier_state)
{
	Dictionary parameters;
	GenerateMouseEventParameters(parameters, button_index);
	GenerateKeyModifierEventParameters(parameters, key_modifier_state);

	bool propagate = true;

	if (button_index == 0)
	{
		Element* new_focus = hover;

		// Set the currently hovered element to focus if it isn't already the focus.
		if (hover)
		{
			new_focus = FindFocusElement(hover);
			if (new_focus && new_focus != focus)
			{
				if (!new_focus->Focus())
					return !IsMouseInteracting();
			}
		}

		// Save the just-pressed-on element as the pressed element.
		active = new_focus;

		// Call 'onmousedown' on every item in the hover chain, and copy the hover chain to the active chain.
		if (hover)
			propagate = hover->DispatchEvent(EventId::Mousedown, parameters);

		if (propagate)
		{
			// Check for a double-click on an element; if one has occured, we send the 'dblclick' event to the hover
			// element. If not, we'll start a timer to catch the next one.
			float mouse_distance_squared = float((mouse_position - last_click_mouse_position).SquaredMagnitude());
			float max_mouse_distance = DOUBLE_CLICK_MAX_DIST * density_independent_pixel_ratio;

			double click_time = GetSystemInterface()->GetElapsedTime();

			if (active == last_click_element && float(click_time - last_click_time) < DOUBLE_CLICK_TIME &&
				mouse_distance_squared < max_mouse_distance * max_mouse_distance)
			{
				if (hover)
					propagate = hover->DispatchEvent(EventId::Dblclick, parameters);

				last_click_element = nullptr;
				last_click_time = 0;
			}
			else
			{
				last_click_element = active;
				last_click_time = click_time;
			}
		}

		last_click_mouse_position = mouse_position;

		active_chain.insert(active_chain.end(), hover_chain.begin(), hover_chain.end());

		if (propagate)
		{
			// Traverse down the hierarchy of the newly focused element (if any), and see if we can begin dragging it.
			drag_started = false;
			drag = hover;
			while (drag)
			{
				Style::Drag drag_style = drag->GetComputedValues().drag();
				switch (drag_style)
				{
				case Style::Drag::None: drag = drag->GetParentNode(); continue;
				case Style::Drag::Block: drag = nullptr; continue;
				default: drag_verbose = (drag_style == Style::Drag::DragDrop || drag_style == Style::Drag::Clone);
				}

				break;
			}
		}
	}
	else
	{
		// Not the primary mouse button, so we're not doing any special processing.
		if (hover)
			propagate = hover->DispatchEvent(EventId::Mousedown, parameters);
	}

	if (scroll_controller->GetMode() == ScrollController::Mode::Autoscroll)
	{
		scroll_controller->Reset();
	}
	else if (button_index == 2 && hover && propagate)
	{
		Dictionary scroll_parameters;
		GenerateMouseEventParameters(scroll_parameters);
		GenerateKeyModifierEventParameters(scroll_parameters, key_modifier_state);
		scroll_parameters["autoscroll"] = true;

		// Dispatch a mouse scroll event, this gives elements an opportunity to block autoscroll from being initialized.
		if (hover->DispatchEvent(EventId::Mousescroll, scroll_parameters))
			scroll_controller->ActivateAutoscroll(hover->GetClosestScrollableContainer(), mouse_position);
	}

	return !IsMouseInteracting();
}